

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportException
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index except_index,TypeVector *sig)

{
  size_type *__return_storage_ptr__;
  Module *this_00;
  undefined1 local_70 [8];
  string_view module_name_local;
  undefined1 local_40 [8];
  string_view field_name_local;
  _Head_base<0UL,_wabt::ExceptionImport_*,_false> local_28;
  
  field_name_local.data_ = (char *)field_name.size_;
  local_40 = (undefined1  [8])field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  local_70 = (undefined1  [8])module_name.data_;
  MakeUnique<wabt::ExceptionImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_70);
  std::__cxx11::string::operator=
            ((string *)
             &((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.
              module_name,(string *)&module_name_local.size_);
  std::__cxx11::string::~string((string *)&module_name_local.size_);
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_40);
  __return_storage_ptr__ = &module_name_local.size_;
  std::__cxx11::string::operator=
            ((string *)
             &((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.
              field_name,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            (&((local_28._M_head_impl)->except).sig,sig);
  this_00 = this->module_;
  GetLocation((Location *)__return_storage_ptr__,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::ExceptionImport,std::default_delete<wabt::ExceptionImport>>,wabt::Location>
            ((wabt *)&field_name_local.size_,
             (unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_> *)
             &local_28,(Location *)__return_storage_ptr__);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&field_name_local.size_);
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  field_name_local.size_ = 0;
  if (local_28._M_head_impl != (ExceptionImport *)0x0) {
    (*((local_28._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import
      [1])();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportException(Index import_index,
                                         string_view module_name,
                                         string_view field_name,
                                         Index except_index,
                                         TypeVector& sig) {
  auto import = MakeUnique<ExceptionImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->except.sig = sig;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}